

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool append_brand(_Bool **current,wchar_t pick)

{
  brand_conflict *pbVar1;
  int iVar2;
  _Bool *p_Var3;
  brand_conflict *brand;
  wchar_t i;
  wchar_t pick_local;
  _Bool **current_local;
  
  pbVar1 = brands;
  if (*current == (_Bool *)0x0) {
    p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
    *current = p_Var3;
    (*current)[pick] = true;
  }
  else {
    for (brand._0_4_ = 1; (int)brand < (int)(uint)z_info->brand_max; brand._0_4_ = (int)brand + 1) {
      if ((((*current)[(int)brand] & 1U) != 0) &&
         (iVar2 = strcmp(brands[(int)brand].name,pbVar1[pick].name), iVar2 == 0)) {
        if (pbVar1[pick].multiplier <= brands[(int)brand].multiplier) {
          return false;
        }
        (*current)[(int)brand] = false;
        (*current)[pick] = true;
        return true;
      }
    }
    (*current)[pick] = true;
  }
  return true;
}

Assistant:

bool append_brand(bool **current, int pick)
{
	int i;
	struct brand *brand = &brands[pick];

	/* No existing brands means OK to add */
	if (!(*current)) {
		*current = mem_zalloc(z_info->brand_max * sizeof(bool));
		(*current)[pick] = true;
		return true;
	}

	/* Check the existing brands for name matches */
	for (i = 1; i < z_info->brand_max; i++) {
		if ((*current)[i]) {
			/* If we get the same element, check the multiplier */
			if (streq(brands[i].name, brand->name)) {
				/* Same multiplier or smaller, fail */
				if (brand->multiplier <= brands[i].multiplier)
					return false;

				/* Greater multiplier, replace and accept */
				(*current)[i] = false;
				(*current)[pick] = true;
				return true;
			}
		}
	}

	/* We can add the new one now */
	(*current)[pick] = true;

	return true;
}